

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Glucose::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  uint in_EAX;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  vec<unsigned_int> *pvVar11;
  int i;
  undefined8 uStack_38;
  int iVar10;
  
  if (this->n_touched != 0) {
    iVar5 = 0;
    iVar9 = (this->subsumption_queue).end;
    iVar8 = (this->subsumption_queue).buf.sz;
    iVar4 = (this->subsumption_queue).first;
    iVar6 = iVar9 - iVar4;
    iVar10 = 0;
    if (iVar9 < iVar4) {
      iVar10 = iVar8;
    }
    iVar9 = iVar10 + iVar6;
    if (iVar9 != 0 && SCARRY4(iVar10,iVar6) == iVar9 < 0) {
      do {
        uVar1 = (this->subsumption_queue).buf.data[(iVar4 + iVar5) % iVar8];
        puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        uVar3 = *(ulong *)(puVar2 + uVar1);
        if ((uVar3 & 3) == 0) {
          *(ulong *)(puVar2 + uVar1) = uVar3 | 2;
        }
        iVar5 = iVar5 + 1;
        iVar9 = (this->subsumption_queue).end;
        iVar8 = (this->subsumption_queue).buf.sz;
        iVar4 = (this->subsumption_queue).first;
        iVar10 = 0;
        if (iVar9 < iVar4) {
          iVar10 = iVar8;
        }
      } while (iVar5 < (iVar9 - iVar4) + iVar10);
    }
    uStack_38 = (ulong)in_EAX;
    if (0 < (this->touched).sz) {
      iVar9 = 0;
      do {
        if ((this->touched).data[iVar9] != '\0') {
          if ((this->occurs).dirty.data[iVar9] != '\0') {
            OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::clean
                      (&this->occurs,(int *)((long)&uStack_38 + 4));
          }
          pvVar11 = (this->occurs).occs.data;
          if (0 < pvVar11[uStack_38._4_4_].sz) {
            pvVar11 = pvVar11 + uStack_38._4_4_;
            lVar7 = 0;
            do {
              if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory
                   [pvVar11->data[lVar7]] & 3) == 0) {
                Queue<unsigned_int>::insert(&this->subsumption_queue,pvVar11->data[lVar7]);
                puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
                *(ulong *)(puVar2 + pvVar11->data[lVar7]) =
                     *(ulong *)(puVar2 + pvVar11->data[lVar7]) & 0xfffffffffffffffc | 2;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < pvVar11->sz);
          }
          (this->touched).data[uStack_38._4_4_] = '\0';
        }
        iVar9 = uStack_38._4_4_ + 1;
        uStack_38 = CONCAT44(iVar9,(undefined4)uStack_38);
      } while (iVar9 < (this->touched).sz);
    }
    iVar5 = 0;
    iVar9 = (this->subsumption_queue).end;
    iVar8 = (this->subsumption_queue).buf.sz;
    iVar4 = (this->subsumption_queue).first;
    iVar6 = iVar9 - iVar4;
    iVar10 = 0;
    if (iVar9 < iVar4) {
      iVar10 = iVar8;
    }
    iVar9 = iVar10 + iVar6;
    if (iVar9 != 0 && SCARRY4(iVar10,iVar6) == iVar9 < 0) {
      do {
        uVar1 = (this->subsumption_queue).buf.data[(iVar4 + iVar5) % iVar8];
        puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        uVar3 = *(ulong *)(puVar2 + uVar1);
        if (((uint)uVar3 & 3) == 2) {
          *(ulong *)(puVar2 + uVar1) = uVar3 & 0xfffffffffffffffc;
        }
        iVar5 = iVar5 + 1;
        iVar9 = (this->subsumption_queue).end;
        iVar8 = (this->subsumption_queue).buf.sz;
        iVar4 = (this->subsumption_queue).first;
        iVar10 = 0;
        if (iVar9 < iVar4) {
          iVar10 = iVar8;
        }
      } while (iVar5 < (iVar9 - iVar4) + iVar10);
    }
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < touched.size(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}